

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<kj::ForkedPromise<void>_> * __thiscall
kj::_::NullableValue<kj::ForkedPromise<void>_>::operator=
          (NullableValue<kj::ForkedPromise<void>_> *this,
          NullableValue<kj::ForkedPromise<void>_> *other)

{
  ForkHub<kj::_::Void> *pFVar1;
  
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t>::dispose(&(this->field_1).value.hub);
    }
    if (other->isSet == true) {
      pFVar1 = (other->field_1).value.hub.ptr;
      (this->field_1).value.hub.disposer = (other->field_1).value.hub.disposer;
      (this->field_1).value.hub.ptr = pFVar1;
      (other->field_1).value.hub.ptr = (ForkHub<kj::_::Void> *)0x0;
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }